

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O2

longdouble *
trng::math::detail::Beta<long_double>(longdouble *__return_storage_ptr__,longdouble x,longdouble y)

{
  int iVar1;
  longdouble *plVar2;
  longdouble in_ST0;
  longdouble in_ST1;
  
  if (Beta<long_double>(long_double,long_double)::ln_max == '\0') {
    iVar1 = __cxa_guard_acquire(&Beta<long_double>(long_double,long_double)::ln_max);
    if (iVar1 != 0) {
      logl();
      Beta<long_double>::ln_max = in_ST0;
      __cxa_guard_release(&Beta<long_double>(long_double,long_double)::ln_max);
      in_ST0 = in_ST1;
    }
  }
  if ((longdouble)0 < x && (longdouble)0 < y) {
    logl();
    if (in_ST0 * (x + y) - (x + y) <= Beta<long_double>::ln_max) {
      tgammal();
      tgammal();
      plVar2 = (longdouble *)tgammal();
    }
    else {
      lgammal();
      lgammal();
      lgammal();
      plVar2 = (longdouble *)expl();
    }
  }
  else {
    plVar2 = (longdouble *)__errno_location();
    *(int *)plVar2 = 0x21;
  }
  return plVar2;
}

Assistant:

TRNG_CUDA_ENABLE T Beta(T x, T y) {
        static const T ln_max{ln(numeric_limits<T>::max())};
        if (x <= 0 or y <= 0) {
#if !(defined TRNG_CUDA)
          errno = EDOM;
#endif
          return numeric_limits<T>::signaling_NaN();
        }
        const T z{x + y};
        if (z * ln(z) - z > ln_max)
          // less accurate but avoids overflow
          return exp(ln_Gamma(x) + ln_Gamma(y) - ln_Gamma(z));
        return Gamma(x) / Gamma(z) * Gamma(y);
      }